

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O2

int sfts_read_key_internal(sfts_t *f,sfkey_t *k)

{
  int *status;
  char cVar1;
  anon_union_8_4_d826882f_for_v *value;
  char *keyname;
  int iVar2;
  fitsfile *fptr;
  
  keyname = k->k;
  if (keyname == (char *)0x0) {
    _p2sc_msg("sfts_read_key_internal",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x1df,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,"NULL keyword");
LAB_00114d86:
    exit(1);
  }
  status = &f->stat;
  cVar1 = k->t;
  if (cVar1 == 'F') {
    (k->v).f = 0.0;
    fptr = f->fts;
    iVar2 = 0x52;
  }
  else {
    if (cVar1 != 'I') {
      if (cVar1 != 'S') {
        _p2sc_msg("sfts_read_key_internal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                  ,499,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,
                  "Keyword %s: unknown key type %d",keyname,(ulong)(uint)(int)cVar1);
        goto LAB_00114d86;
      }
      *(k->v).s = '\0';
      fptr = f->fts;
      keyname = k->k;
      value = (anon_union_8_4_d826882f_for_v *)(k->v).s;
      iVar2 = 0x10;
      goto LAB_00114cff;
    }
    (k->v).f = 0.0;
    fptr = f->fts;
    iVar2 = 0x51;
  }
  value = &k->v;
LAB_00114cff:
  ffgky(fptr,iVar2,keyname,value,(char *)0x0,status);
  iVar2 = *status;
  if (iVar2 == 0xcc) {
    *status = 0;
  }
  return (uint)(iVar2 != 0xcc);
}

Assistant:

static int sfts_read_key_internal(sfts_t *f, sfkey_t *k) {
    int *s = &f->stat;

    if (!k->k) {
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "NULL keyword");
        return 0;
    }

    switch (k->t) {
    case 'S':
        *k->v.s = 0;
        fits_read_key(f->fts, TSTRING, k->k, k->v.s, NULL, s);
        break;
    case 'I':
        /* long long */
        k->v.i = 0;
        fits_read_key(f->fts, TLONGLONG, k->k, &k->v.i, NULL, s);
        break;
    case 'F':
        /* double */
        k->v.f = 0;
        fits_read_key(f->fts, TDOUBLE, k->k, &k->v.f, NULL, s);
        break;
    default:
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "Keyword %s: unknown key type %d", k->k, k->t);
        return 0;
    }

    if (*s == VALUE_UNDEFINED) {
        *s = 0;
        return 0;
    }
    return 1;
}